

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::SetMessagePbInterval
          (Generator *this,Descriptor *descriptor)

{
  long lVar1;
  long lVar2;
  long lVar3;
  EnumDescriptorProto proto;
  DescriptorProto message_proto;
  string local_1a8;
  EnumDescriptorProto local_188;
  DescriptorProto local_118;
  
  DescriptorProto::DescriptorProto(&local_118,(Arena *)0x0,false);
  ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)&local_188,this,descriptor);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (this,descriptor,&local_118,(string *)&local_188);
  if ((HasBits<1UL> *)local_188.super_Message.super_MessageLite._vptr_MessageLite !=
      &local_188._has_bits_) {
    operator_delete(local_188.super_Message.super_MessageLite._vptr_MessageLite);
  }
  if (0 < *(int *)(descriptor + 0x70)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      SetMessagePbInterval(this,(Descriptor *)(*(long *)(descriptor + 0x38) + lVar3));
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x88;
    } while (lVar2 < *(int *)(descriptor + 0x70));
  }
  if (0 < *(int *)(descriptor + 0x74)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      EnumDescriptorProto::EnumDescriptorProto(&local_188,(Arena *)0x0,false);
      lVar1 = *(long *)(descriptor + 0x40);
      ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
                (&local_1a8,this,(EnumDescriptor *)(lVar1 + lVar2));
      PrintSerializedPbInterval<google::protobuf::EnumDescriptor,google::protobuf::EnumDescriptorProto>
                (this,(EnumDescriptor *)(lVar1 + lVar2),&local_188,&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      EnumDescriptorProto::~EnumDescriptorProto(&local_188);
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x48;
    } while (lVar3 < *(int *)(descriptor + 0x74));
  }
  DescriptorProto::~DescriptorProto(&local_118);
  return;
}

Assistant:

void Generator::SetMessagePbInterval(const Descriptor& descriptor) const {
  DescriptorProto message_proto;
  PrintSerializedPbInterval(descriptor, message_proto,
                            ModuleLevelDescriptorName(descriptor));

  // Nested messages.
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    SetMessagePbInterval(*descriptor.nested_type(i));
  }

  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    EnumDescriptorProto proto;
    const EnumDescriptor& enum_des = *descriptor.enum_type(i);
    PrintSerializedPbInterval(enum_des, proto,
                              ModuleLevelDescriptorName(enum_des));
  }
}